

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O3

bool __thiscall pktalloc::Allocator::IntegrityCheck(Allocator *this)

{
  uint uVar1;
  WindowHeader **ppWVar2;
  WindowHeader *pWVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  
  uVar1 = (this->PreferredWindows).Size;
  if (uVar1 == 0) {
    iVar7 = 0;
  }
  else {
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar17 = vpbroadcastq_avx512f(ZEXT816(0x1f));
    ppWVar2 = (this->PreferredWindows).DataPtr;
    iVar7 = 0;
    uVar8 = 0;
    do {
      pWVar3 = ppWVar2[(int)uVar8];
      if (pWVar3 == (WindowHeader *)0x0) {
        return false;
      }
      uVar6 = 0;
      if (pWVar3->FullListIndex != -1) goto LAB_00111d13;
      do {
        if ((uVar8 != uVar6) && (pWVar3 == ppWVar2[(int)uVar6])) {
          return false;
        }
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
      if (pWVar3->FreeUnitCount - 0x801 < 0xfffff800) {
        return false;
      }
      if (0x800 < pWVar3->ResumeScanOffset) {
        return false;
      }
      lVar10 = 0;
      auVar18 = ZEXT464((uint)POPCOUNT(*(undefined8 *)pWVar3));
      do {
        auVar20 = auVar18;
        auVar18 = vpbroadcastq_avx512f();
        auVar18 = vporq_avx512f(auVar18,auVar16);
        uVar5 = vpcmpuq_avx512f(auVar18,auVar17,1);
        auVar18 = vmovdqu64_avx512f(*(undefined1 (*) [64])(&pWVar3->field_0x8 + lVar10 * 8));
        auVar19._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar18._8_8_;
        auVar19._0_8_ = (ulong)((byte)uVar5 & 1) * auVar18._0_8_;
        auVar19._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar18._16_8_;
        auVar19._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar18._24_8_;
        auVar19._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar18._32_8_;
        auVar19._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar18._40_8_;
        auVar19._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar18._48_8_;
        auVar19._56_8_ = (uVar5 >> 7) * auVar18._56_8_;
        lVar10 = lVar10 + 8;
        auVar18 = vpopcntq_avx512_vpopcntdq(auVar19);
        auVar13 = vpmovqd_avx512f(auVar18);
        auVar13 = vpaddd_avx2(auVar20._0_32_,auVar13);
        auVar18 = ZEXT3264(auVar13);
      } while (lVar10 != 0x20);
      auVar13 = vmovdqa32_avx512vl(auVar13);
      bVar4 = (bool)((byte)uVar5 & 1);
      auVar11._0_4_ = (uint)bVar4 * auVar13._0_4_ | (uint)!bVar4 * auVar20._0_4_;
      bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar11._4_4_ = (uint)bVar4 * auVar13._4_4_ | (uint)!bVar4 * auVar20._4_4_;
      bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar11._8_4_ = (uint)bVar4 * auVar13._8_4_ | (uint)!bVar4 * auVar20._8_4_;
      bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar11._12_4_ = (uint)bVar4 * auVar13._12_4_ | (uint)!bVar4 * auVar20._12_4_;
      bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
      auVar14._16_4_ = (uint)bVar4 * auVar13._16_4_ | (uint)!bVar4 * auVar20._16_4_;
      auVar14._0_16_ = auVar11;
      bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
      auVar14._20_4_ = (uint)bVar4 * auVar13._20_4_ | (uint)!bVar4 * auVar20._20_4_;
      bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
      auVar14._24_4_ = (uint)bVar4 * auVar13._24_4_ | (uint)!bVar4 * auVar20._24_4_;
      bVar4 = SUB81(uVar5 >> 7,0);
      auVar14._28_4_ = (uint)bVar4 * auVar13._28_4_ | (uint)!bVar4 * auVar20._28_4_;
      auVar11 = vphaddd_avx(auVar14._16_16_,auVar11);
      auVar11 = vphaddd_avx(auVar11,auVar11);
      auVar11 = vphaddd_avx(auVar11,auVar11);
      if (auVar11._0_4_ != 0x800 - pWVar3->FreeUnitCount) {
        return false;
      }
      uVar8 = uVar8 + 1;
      iVar7 = iVar7 + (uint)pWVar3->Preallocated;
    } while (uVar8 != uVar1);
  }
  uVar8 = (this->FullWindows).Size;
  if (uVar8 != 0) {
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar17 = vpbroadcastq_avx512f(ZEXT816(0x1f));
    ppWVar2 = (this->FullWindows).DataPtr;
    uVar6 = 0;
    do {
      pWVar3 = ppWVar2[(int)uVar6];
      if ((pWVar3 == (WindowHeader *)0x0) || (pWVar3->FullListIndex != uVar6)) {
        return false;
      }
      if (uVar1 != 0) {
        uVar9 = 0;
        do {
          if (pWVar3 == (this->PreferredWindows).DataPtr[(int)uVar9]) {
            return false;
          }
          uVar9 = uVar9 + 1;
        } while (uVar1 != uVar9);
      }
      uVar9 = 0;
      do {
        if ((uVar6 != uVar9) && (pWVar3 == ppWVar2[(int)uVar9])) {
          return false;
        }
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
      if (0x800 < pWVar3->ResumeScanOffset) {
        return false;
      }
      lVar10 = 0;
      auVar18 = ZEXT464((uint)POPCOUNT(*(undefined8 *)pWVar3));
      do {
        auVar19 = auVar18;
        auVar18 = vpbroadcastq_avx512f();
        auVar18 = vporq_avx512f(auVar18,auVar16);
        uVar5 = vpcmpuq_avx512f(auVar18,auVar17,1);
        auVar18 = vmovdqu64_avx512f(*(undefined1 (*) [64])(&pWVar3->field_0x8 + lVar10 * 8));
        auVar20._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar18._8_8_;
        auVar20._0_8_ = (ulong)((byte)uVar5 & 1) * auVar18._0_8_;
        auVar20._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar18._16_8_;
        auVar20._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar18._24_8_;
        auVar20._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar18._32_8_;
        auVar20._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar18._40_8_;
        auVar20._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar18._48_8_;
        auVar20._56_8_ = (uVar5 >> 7) * auVar18._56_8_;
        lVar10 = lVar10 + 8;
        auVar18 = vpopcntq_avx512_vpopcntdq(auVar20);
        auVar13 = vpmovqd_avx512f(auVar18);
        auVar13 = vpaddd_avx2(auVar19._0_32_,auVar13);
        auVar18 = ZEXT3264(auVar13);
      } while (lVar10 != 0x20);
      auVar13 = vmovdqa32_avx512vl(auVar13);
      bVar4 = (bool)((byte)uVar5 & 1);
      auVar12._0_4_ = (uint)bVar4 * auVar13._0_4_ | (uint)!bVar4 * auVar19._0_4_;
      bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar12._4_4_ = (uint)bVar4 * auVar13._4_4_ | (uint)!bVar4 * auVar19._4_4_;
      bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar12._8_4_ = (uint)bVar4 * auVar13._8_4_ | (uint)!bVar4 * auVar19._8_4_;
      bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar12._12_4_ = (uint)bVar4 * auVar13._12_4_ | (uint)!bVar4 * auVar19._12_4_;
      bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
      auVar15._16_4_ = (uint)bVar4 * auVar13._16_4_ | (uint)!bVar4 * auVar19._16_4_;
      auVar15._0_16_ = auVar12;
      bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
      auVar15._20_4_ = (uint)bVar4 * auVar13._20_4_ | (uint)!bVar4 * auVar19._20_4_;
      bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
      auVar15._24_4_ = (uint)bVar4 * auVar13._24_4_ | (uint)!bVar4 * auVar19._24_4_;
      bVar4 = SUB81(uVar5 >> 7,0);
      auVar15._28_4_ = (uint)bVar4 * auVar13._28_4_ | (uint)!bVar4 * auVar19._28_4_;
      auVar11 = vphaddd_avx(auVar15._16_16_,auVar12);
      auVar11 = vphaddd_avx(auVar11,auVar11);
      auVar11 = vphaddd_avx(auVar11,auVar11);
      if (auVar11._0_4_ != 0x800 - pWVar3->FreeUnitCount) {
        return false;
      }
      uVar6 = uVar6 + 1;
      iVar7 = iVar7 + (uint)pWVar3->Preallocated;
    } while (uVar6 != uVar8);
  }
  uVar6 = (uint)(iVar7 == 2);
LAB_00111d13:
  return SUB41(uVar6,0);
}

Assistant:

PKTALLOC_FORCE_INLINE unsigned GetSize() const
    {
        return Size;
    }